

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

void App::execute(int argc,char **argv)

{
  ostream *poVar1;
  runtime_error *this;
  vector<Config::Size,_std::allocator<Config::Size>_> *pages_00;
  Library library;
  vector<Config::Size,_std::allocator<Config::Size>_> pages;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  Font font;
  Glyphs glyphs;
  Config config;
  
  ProgramOptions::parseCommandLine(&config,argc,argv);
  ft::Library::Library(&library);
  if (config.verbose == true) {
    poVar1 = std::operator<<((ostream *)&std::cout,"freetype ");
    ft::Library::getVersionString_abi_cxx11_((string *)&font,&library);
    poVar1 = std::operator<<(poVar1,(string *)&font);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&font);
  }
  pages_00 = (vector<Config::Size,_std::allocator<Config::Size>_> *)(ulong)config.monochrome;
  ft::Font::Font(&font,&library,&config.fontFile,(uint)config.fontSize,0,config.monochrome);
  collectGlyphInfo(&glyphs,&font,&config.chars);
  arrangeGlyphs(&pages,&glyphs,&config);
  if ((config.useMaxTextureCount == true) &&
     ((ulong)config.maxTextureCount <
      (ulong)((long)pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3))) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"too many generated textures (more than --max-texture-count)");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  renderTextures_abi_cxx11_
            (&fileNames,(App *)&glyphs,(Glyphs *)&config,(Config *)&font,(Font *)&pages,pages_00);
  writeFontInfoFile(&glyphs,&config,&font,&fileNames,&pages);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&fileNames);
  std::_Vector_base<Config::Size,_std::allocator<Config::Size>_>::~_Vector_base
            (&pages.super__Vector_base<Config::Size,_std::allocator<Config::Size>_>);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphInfo>_>_>
  ::~_Rb_tree(&glyphs._M_t);
  ft::Font::~Font(&font);
  ft::Library::~Library(&library);
  Config::~Config(&config);
  return;
}

Assistant:

void App::execute(const int argc, char* argv[])
{
    const auto config = ProgramOptions::parseCommandLine(argc, argv);

    ft::Library library;
    if (config.verbose)
        std::cout << "freetype " << library.getVersionString() << "\n";

    ft::Font font(library, config.fontFile, config.fontSize, 0, config.monochrome);

    auto glyphs = collectGlyphInfo(font, config.chars);
    const auto pages = arrangeGlyphs(glyphs, config);
    if (config.useMaxTextureCount && pages.size() > config.maxTextureCount)
        throw std::runtime_error("too many generated textures (more than --max-texture-count)");

    const auto fileNames = renderTextures(glyphs, config, font, pages);
    writeFontInfoFile(glyphs, config, font, fileNames, pages);
}